

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ostream_iterator<char,_char,_std::char_traits<char>_>
fmt::v5::internal::
format_decimal<char,unsigned_int,std::ostream_iterator<char,char,std::char_traits<char>>,fmt::v5::internal::add_thousands_sep<char>>
          (ostream_iterator<char,_char,_std::char_traits<char>_> *out,uint value,int num_digits,
          add_thousands_sep<char> sep)

{
  add_thousands_sep<char> thousands_sep;
  ostream_iterator<char,_char,_std::char_traits<char>_> *it;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RSI;
  ostream_type *in_RDI;
  type tVar1;
  ostream_iterator<char,_char,_std::char_traits<char>_> oVar2;
  char *end;
  char_type buffer [13];
  ostream_type *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  
  thousands_sep.sep_.size_ = (size_t)in_stack_ffffffffffffffa8;
  thousands_sep.sep_.data_ = (char *)in_RDI;
  thousands_sep._16_8_ = in_stack_ffffffffffffffb0;
  it = (ostream_iterator<char,_char,_std::char_traits<char>_> *)
       format_decimal<unsigned_int,char,fmt::v5::internal::add_thousands_sep<char>>
                 ((char *)in_RDI,(uint)((ulong)in_RSI >> 0x20),(int)in_RSI,thousands_sep);
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator
            ((ostream_iterator<char,_char,_std::char_traits<char>_> *)&stack0xffffffffffffffa8,
             in_RSI);
  tVar1 = copy_str<char,char*,std::ostream_iterator<char,char,std::char_traits<char>>>
                    ((char *)in_stack_ffffffffffffffa8,(char *)in_RDI,it);
  oVar2._M_string = tVar1._M_string;
  oVar2._M_stream = in_RDI;
  return oVar2;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}